

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx2.cpp
# Opt level: O1

void ncnn::pack_A_tile_int8_avx2(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  void *pvVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  undefined1 (*pauVar7) [16];
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  long lVar15;
  uint uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar19 [32];
  
  iVar6 = cpu_support_x86_avx_vnni_int8();
  if (iVar6 != 0) {
    pack_A_tile_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk);
    return;
  }
  iVar6 = cpu_support_x86_avx_vnni();
  auVar5 = _DAT_00601c20;
  if (iVar6 != 0) {
    pack_A_tile_int8_avxvnni(A,AT,i,max_ii,k,max_kk);
    return;
  }
  pauVar7 = (undefined1 (*) [16])AT->data;
  uVar12 = 0;
  if (7 < max_ii) {
    auVar4 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar17._8_4_ = 0xc080400;
    auVar17._0_8_ = 0xc0804000c080400;
    auVar17._12_4_ = 0xc080400;
    auVar17._16_4_ = 0xc080400;
    auVar17._20_4_ = 0xc080400;
    auVar17._24_4_ = 0xc080400;
    auVar17._28_4_ = 0xc080400;
    uVar9 = 0;
    do {
      iVar6 = A->w;
      auVar19._4_4_ = iVar6;
      auVar19._0_4_ = iVar6;
      auVar19._8_4_ = iVar6;
      auVar19._12_4_ = iVar6;
      auVar19._16_4_ = iVar6;
      auVar19._20_4_ = iVar6;
      auVar19._24_4_ = iVar6;
      auVar19._28_4_ = iVar6;
      vpmulld_avx2(auVar19,auVar4);
      if (max_kk < 2) {
        uVar16 = 0;
      }
      else {
        iVar6 = 1;
        do {
          auVar19 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
          auVar19 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar19);
          auVar19 = vpshufb_avx2(auVar19,auVar5);
          auVar19 = vpermq_avx2(auVar19,0xe8);
          in_ZMM4 = ZEXT3264(auVar19);
          *pauVar7 = auVar19._0_16_;
          pauVar7 = pauVar7 + 1;
          iVar6 = iVar6 + 2;
          uVar16 = max_kk & 0xfffffffe;
        } while (iVar6 < max_kk);
      }
      iVar6 = max_kk - uVar16;
      if (iVar6 != 0 && (int)uVar16 <= max_kk) {
        do {
          auVar19 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
          auVar19 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar19);
          auVar19 = vpshufb_avx2(auVar19,auVar17);
          auVar3 = vpunpckldq_avx(auVar19._0_16_,auVar19._16_16_);
          in_ZMM4 = ZEXT1664(auVar3);
          *(long *)*pauVar7 = auVar3._0_8_;
          pauVar7 = (undefined1 (*) [16])((long)*pauVar7 + 8);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      uVar12 = uVar9 + 8;
      uVar11 = uVar9 + 0xf;
      uVar9 = uVar12;
    } while (uVar11 < (uint)max_ii);
  }
  if ((int)((uint)uVar12 | 3) < max_ii) {
    auVar3 = vpmovsxbd_avx(ZEXT416(0x3020100));
    uVar9 = uVar12 & 0xffffffff;
    do {
      iVar6 = A->w;
      auVar18._4_4_ = iVar6;
      auVar18._0_4_ = iVar6;
      auVar18._8_4_ = iVar6;
      auVar18._12_4_ = iVar6;
      vpmulld_avx(auVar18,auVar3);
      uVar16 = 0;
      if (1 < max_kk) {
        iVar6 = 1;
        do {
          auVar18 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
          auVar18 = vpgatherdd((undefined1  [16])0x0,auVar18);
          auVar18 = vpshufb_avx(auVar18,ZEXT816(0xd0c090805040100));
          in_ZMM4 = ZEXT1664(auVar18);
          *(long *)*pauVar7 = auVar18._0_8_;
          pauVar7 = (undefined1 (*) [16])((long)*pauVar7 + 8);
          iVar6 = iVar6 + 2;
          uVar16 = max_kk & 0xfffffffe;
        } while (iVar6 < max_kk);
      }
      iVar6 = max_kk - uVar16;
      if (iVar6 != 0 && (int)uVar16 <= max_kk) {
        do {
          auVar18 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
          auVar18 = vpgatherdd((undefined1  [16])0x0,auVar18);
          auVar18 = vpshufb_avx(auVar18,SUB6416(ZEXT464(0xc080400),0));
          in_ZMM4 = ZEXT1664(auVar18);
          *(int *)*pauVar7 = auVar18._0_4_;
          pauVar7 = (undefined1 (*) [16])((long)*pauVar7 + 4);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      uVar12 = uVar9 + 4;
      lVar8 = uVar9 + 7;
      uVar9 = uVar12;
    } while (lVar8 < max_ii);
  }
  if ((int)((uint)uVar12 | 1) < max_ii) {
    uVar9 = uVar12 & 0xffffffff;
    do {
      lVar8 = (long)A->w * A->elemsize;
      puVar13 = (undefined1 *)((long)A->data + (uVar9 + (long)i) * lVar8 + (long)k);
      puVar14 = (undefined1 *)((long)A->data + (uVar9 + (long)i + 1) * lVar8 + (long)k);
      if (max_kk < 2) {
        uVar16 = 0;
      }
      else {
        iVar6 = 1;
        do {
          (*pauVar7)[0] = *puVar13;
          *(undefined1 *)((long)*pauVar7 + 1) = puVar13[1];
          *(undefined1 *)((long)*pauVar7 + 2) = *puVar14;
          *(undefined1 *)((long)*pauVar7 + 3) = puVar14[1];
          pauVar7 = (undefined1 (*) [16])((long)*pauVar7 + 4);
          puVar13 = puVar13 + 2;
          puVar14 = puVar14 + 2;
          iVar6 = iVar6 + 2;
          uVar16 = max_kk & 0xfffffffe;
        } while (iVar6 < max_kk);
      }
      if ((int)uVar16 < max_kk) {
        lVar8 = 0;
        do {
          (*pauVar7)[0] = puVar13[lVar8];
          *(undefined1 *)((long)*pauVar7 + 1) = puVar14[lVar8];
          pauVar7 = (undefined1 (*) [16])((long)*pauVar7 + 2);
          lVar8 = lVar8 + 1;
        } while (max_kk - uVar16 != (int)lVar8);
      }
      uVar12 = uVar9 + 2;
      lVar8 = uVar9 + 3;
      uVar9 = uVar12;
    } while (lVar8 < max_ii);
  }
  if ((int)uVar12 < max_ii) {
    lVar8 = (long)(int)uVar12;
    lVar10 = i + lVar8;
    do {
      if (0 < max_kk) {
        iVar6 = A->w;
        pvVar1 = A->data;
        sVar2 = A->elemsize;
        lVar15 = 0;
        do {
          *(undefined1 *)((long)*pauVar7 + lVar15) =
               *(undefined1 *)((long)pvVar1 + lVar15 + sVar2 * lVar10 * (long)iVar6 + (long)k);
          lVar15 = lVar15 + 1;
        } while (max_kk != (int)lVar15);
        pauVar7 = (undefined1 (*) [16])((long)*pauVar7 + lVar15);
      }
      lVar8 = lVar8 + 1;
      lVar10 = lVar10 + 1;
    } while (lVar8 != max_ii);
  }
  return;
}

Assistant:

void pack_A_tile_int8_avx2(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
}